

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

Dist * Omega_h::close_up(Dist *__return_storage_ptr__,Mesh *mesh,RemoteGraph *own_verts2own_elems,
                        Dist *verts2owners)

{
  LO nrroots;
  Read<long> local_320;
  Dist local_310;
  undefined1 local_279;
  undefined1 local_278 [8];
  Read<long> old_owner_globals;
  undefined1 local_248 [24];
  Dist uses2old_owners;
  RemoteGraph local_108;
  undefined1 local_d8 [8];
  Remotes elem_uses;
  Dist own_verts2verts;
  Dist *verts2owners_local;
  RemoteGraph *own_verts2own_elems_local;
  Mesh *mesh_local;
  Dist *elems2owners;
  
  Dist::invert((Dist *)&elem_uses.idxs.write_.shared_alloc_.direct_ptr,verts2owners);
  RemoteGraph::RemoteGraph(&local_108,own_verts2own_elems);
  Dist::Dist((Dist *)&uses2old_owners.comm_[1].
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Dist *)&elem_uses.idxs.write_.shared_alloc_.direct_ptr);
  push_elem_uses((Remotes *)local_d8,&local_108,
                 (Dist *)&uses2old_owners.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  Dist::~Dist((Dist *)&uses2old_owners.comm_[1].
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  RemoteGraph::~RemoteGraph(&local_108);
  Mesh::comm((Mesh *)local_248);
  Remotes::Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,(Remotes *)local_d8
                  );
  nrroots = Mesh::nelems(mesh);
  Dist::Dist((Dist *)(local_248 + 0x10),(CommPtr *)local_248,
             (Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,nrroots);
  Remotes::~Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_248);
  Mesh::dim(mesh);
  Mesh::globals((Mesh *)local_278,(Int)mesh);
  local_279 = 0;
  Dist::Dist(&local_310,(Dist *)(local_248 + 0x10));
  Read<long>::Read(&local_320,(Read<int> *)local_278);
  get_new_copies2old_owners(__return_storage_ptr__,&local_310,&local_320);
  Read<long>::~Read(&local_320);
  Dist::~Dist(&local_310);
  local_279 = 1;
  Read<long>::~Read((Read<long> *)local_278);
  Dist::~Dist((Dist *)(local_248 + 0x10));
  Remotes::~Remotes((Remotes *)local_d8);
  Dist::~Dist((Dist *)&elem_uses.idxs.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

static Dist close_up(
    Mesh* mesh, RemoteGraph own_verts2own_elems, Dist verts2owners) {
  auto own_verts2verts = verts2owners.invert();
  auto elem_uses = push_elem_uses(own_verts2own_elems, own_verts2verts);
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  return elems2owners;
}